

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c1a11d::LevelTest::PreEncodeFrameHook
          (LevelTest *this,VideoSource *video,Encoder *encoder)

{
  bool bVar1;
  int iVar2;
  AssertHelper *this_00;
  long *in_RSI;
  char *in_RDI;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  int num_operating_points;
  AssertHelper *in_stack_ffffffffffffff40;
  int *in_stack_ffffffffffffff48;
  char *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff60;
  Type in_stack_ffffffffffffff6c;
  AssertHelper *in_stack_ffffffffffffff70;
  AssertionResult local_70;
  uint in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  uint uVar3;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  Encoder *in_stack_ffffffffffffffb0;
  Message *in_stack_ffffffffffffffb8;
  AssertHelper *in_stack_ffffffffffffffc0;
  AssertionResult local_30 [3];
  
  iVar2 = (**(code **)(*in_RSI + 0x40))();
  if (iVar2 == 0) {
    libaom_test::Encoder::Control
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
    libaom_test::Encoder::Control
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
    if (*(int *)(in_RDI + 0x3f4) != 0) {
      libaom_test::Encoder::Control
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
      libaom_test::Encoder::Control
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
      libaom_test::Encoder::Control
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
    }
  }
  libaom_test::Encoder::Control
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
             (int *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_RDI,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
             (int *)in_stack_ffffffffffffff40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_30);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff70);
    in_stack_ffffffffffffff50 =
         testing::AssertionResult::failure_message((AssertionResult *)0x8b0256);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff60,
               (int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffff50);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffff40);
    testing::Message::~Message((Message *)0x8b02aa);
  }
  uVar3 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x8b031f);
  if (uVar3 == 0) {
    libaom_test::Encoder::Control
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
               (int *)(ulong)in_stack_ffffffffffffffa0);
    testing::internal::CmpHelperLE<int,int>
              (in_RDI,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
               (int *)in_stack_ffffffffffffff40);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_70);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_ffffffffffffff70);
      in_stack_ffffffffffffff48 =
           (int *)testing::AssertionResult::failure_message((AssertionResult *)0x8b03b4);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff60,
                 (int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffff50);
      testing::internal::AssertHelper::operator=
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffff40);
      testing::Message::~Message((Message *)0x8b0402);
    }
    uVar3 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x8b046e);
    if (uVar3 == 0) {
      testing::internal::CmpHelperGE<int,int>
                (in_RDI,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                 (int *)in_stack_ffffffffffffff40);
      iVar2 = (int)((ulong)in_RDI >> 0x20);
      bVar1 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xffffffffffffff70);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_ffffffffffffff70);
        this_00 = (AssertHelper *)
                  testing::AssertionResult::failure_message((AssertionResult *)0x8b04e2);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff60,
                   iVar2,in_stack_ffffffffffffff50);
        testing::internal::AssertHelper::operator=
                  (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
        testing::internal::AssertHelper::~AssertHelper(this_00);
        testing::Message::~Message((Message *)0x8b0530);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x8b0599);
    }
  }
  return;
}

Assistant:

void PreEncodeFrameHook(::libaom_test::VideoSource *video,
                          ::libaom_test::Encoder *encoder) override {
    if (video->frame() == 0) {
      encoder->Control(AOME_SET_CPUUSED, cpu_used_);
      encoder->Control(AV1E_SET_TARGET_SEQ_LEVEL_IDX, target_level_);
      if (encoding_mode_ != ::libaom_test::kRealTime) {
        encoder->Control(AOME_SET_ENABLEAUTOALTREF, 1);
        encoder->Control(AOME_SET_ARNR_MAXFRAMES, 7);
        encoder->Control(AOME_SET_ARNR_STRENGTH, 5);
      }
    }

    int num_operating_points;
    encoder->Control(AV1E_GET_NUM_OPERATING_POINTS, &num_operating_points);
    ASSERT_EQ(num_operating_points, 1);
    encoder->Control(AV1E_GET_SEQ_LEVEL_IDX, level_);
    ASSERT_LE(level_[0], kLevelMax);
    ASSERT_GE(level_[0], kLevelMin);
  }